

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Repeat_Button.cxx
# Opt level: O0

int __thiscall Fl_Repeat_Button::handle(Fl_Repeat_Button *this,int event)

{
  uint uVar1;
  int iVar2;
  int local_20;
  int newval;
  int event_local;
  Fl_Repeat_Button *this_local;
  
  if (event == 1) {
LAB_001d1949:
    iVar2 = Fl::visible_focus();
    if (iVar2 != 0) {
      Fl::focus((Fl_Widget *)this);
    }
    local_20 = Fl::event_inside((Fl_Widget *)this);
  }
  else {
    if (event != 2) {
      if (event == 5) goto LAB_001d1949;
      if ((event != 0xd) && (event != 0xf)) {
        iVar2 = Fl_Button::handle(&this->super_Fl_Button,event);
        return iVar2;
      }
    }
    local_20 = 0;
  }
  uVar1 = Fl_Widget::active((Fl_Widget *)this);
  if (uVar1 == 0) {
    local_20 = 0;
  }
  iVar2 = Fl_Button::value(&this->super_Fl_Button,local_20);
  if (iVar2 != 0) {
    if (local_20 == 0) {
      Fl::remove_timeout(repeat_callback,this);
    }
    else {
      Fl::add_timeout(0.5,repeat_callback,this);
      Fl_Widget::do_callback((Fl_Widget *)this);
    }
  }
  return 1;
}

Assistant:

int Fl_Repeat_Button::handle(int event) {
  int newval;
  switch (event) {
  case FL_HIDE:
  case FL_DEACTIVATE:
  case FL_RELEASE:
    newval = 0; goto J1;
  case FL_PUSH:
  case FL_DRAG:
    if (Fl::visible_focus()) Fl::focus(this);
    newval = Fl::event_inside(this);
  J1:
    if (!active()) 
      newval = 0;
    if (value(newval)) {
      if (newval) {
	Fl::add_timeout(INITIALREPEAT,repeat_callback,this);
	do_callback();
      } else {
	Fl::remove_timeout(repeat_callback,this);
      }
    }
    return 1;
  default:
    return Fl_Button::handle(event);
  }
}